

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void __thiscall
wallet::coinselector_tests::knapsack_solver_test::test_method(knapsack_solver_test *this)

{
  long lVar1;
  undefined8 uVar2;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *pvVar3;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar4;
  CAmount CVar5;
  short sVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator pvVar8;
  FastRandomContext *pFVar9;
  optional<wallet::SelectionResult> *in_R9;
  _Optional_payload_base<wallet::SelectionResult> *p_Var10;
  optional<wallet::SelectionResult> *poVar11;
  _Base_ptr *pp_Var12;
  int iVar13;
  int iVar14;
  long in_FS_OFFSET;
  bool bVar15;
  double dVar16;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  const_string msg_63;
  const_string msg_64;
  const_string msg_65;
  const_string msg_66;
  const_string msg_67;
  const_string msg_68;
  const_string msg_69;
  const_string msg_70;
  const_string msg_71;
  const_string msg_72;
  const_string msg_73;
  const_string msg_74;
  const_string msg_75;
  const_string msg_76;
  const_string msg_77;
  const_string msg_78;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string file_63;
  const_string file_64;
  const_string file_65;
  const_string file_66;
  const_string file_67;
  const_string file_68;
  const_string file_69;
  const_string file_70;
  const_string file_71;
  const_string file_72;
  const_string file_73;
  const_string file_74;
  const_string file_75;
  const_string file_76;
  const_string file_77;
  const_string file_78;
  check_type cVar17;
  int in_stack_ffffffffffffe4d8;
  char *local_1b20;
  char *local_1b18;
  undefined1 *local_1b10;
  undefined1 *local_1b08;
  char *local_1b00;
  char *local_1af8;
  char *local_1af0;
  char *local_1ae8;
  undefined1 *local_1ae0;
  undefined1 *local_1ad8;
  char *local_1ad0;
  char *local_1ac8;
  char *local_1ac0;
  char *local_1ab8;
  undefined1 *local_1ab0;
  undefined1 *local_1aa8;
  char *local_1aa0;
  char *local_1a98;
  char *local_1a90;
  char *local_1a88;
  undefined1 *local_1a80;
  undefined1 *local_1a78;
  char *local_1a70;
  char *local_1a68;
  char *local_1a60;
  char *local_1a58;
  undefined1 *local_1a50;
  undefined1 *local_1a48;
  char *local_1a40;
  char *local_1a38;
  char *local_1a30;
  char *local_1a28;
  undefined1 *local_1a20;
  undefined1 *local_1a18;
  char *local_1a10;
  char *local_1a08;
  char *local_1a00;
  char *local_19f8;
  undefined1 *local_19f0;
  undefined1 *local_19e8;
  char *local_19e0;
  char *local_19d8;
  char *local_19d0;
  char *local_19c8;
  undefined1 *local_19c0;
  undefined1 *local_19b8;
  char *local_19b0;
  char *local_19a8;
  char *local_19a0;
  char *local_1998;
  undefined1 *local_1990;
  undefined1 *local_1988;
  char *local_1980;
  char *local_1978;
  char *local_1970;
  char *local_1968;
  undefined1 *local_1960;
  undefined1 *local_1958;
  char *local_1950;
  char *local_1948;
  char *local_1940;
  char *local_1938;
  undefined1 *local_1930;
  undefined1 *local_1928;
  char *local_1920;
  char *local_1918;
  char *local_1910;
  char *local_1908;
  undefined1 *local_1900;
  undefined1 *local_18f8;
  char *local_18f0;
  char *local_18e8;
  char *local_18e0;
  char *local_18d8;
  undefined1 *local_18d0;
  undefined1 *local_18c8;
  char *local_18c0;
  char *local_18b8;
  char *local_18b0;
  char *local_18a8;
  undefined1 *local_18a0;
  undefined1 *local_1898;
  char *local_1890;
  char *local_1888;
  char *local_1880;
  char *local_1878;
  undefined1 *local_1870;
  undefined1 *local_1868;
  char *local_1860;
  char *local_1858;
  char *local_1850;
  char *local_1848;
  undefined1 *local_1840;
  undefined1 *local_1838;
  char *local_1830;
  char *local_1828;
  char *local_1820;
  char *local_1818;
  undefined1 local_1810 [16];
  _Rb_tree_node_base local_1800;
  undefined1 local_17e0 [24];
  undefined1 *local_17c8 [2];
  char *local_17b8 [2];
  char *local_17a8 [2];
  undefined1 *local_1798 [2];
  char *local_1788 [2];
  char *local_1778;
  char *local_1770;
  undefined1 *local_1768;
  undefined1 *local_1760;
  char *local_1758;
  char *local_1750;
  char *local_1748;
  char *local_1740;
  undefined1 *local_1738;
  undefined1 *local_1730;
  char *local_1728;
  char *local_1720;
  char *local_1718;
  char *local_1710;
  undefined1 *local_1708;
  undefined1 *local_1700;
  char *local_16f8;
  char *local_16f0;
  char *local_16e8;
  char *local_16e0;
  undefined1 *local_16d8;
  undefined1 *local_16d0;
  char *local_16c8;
  char *local_16c0;
  char *local_16b8;
  char *local_16b0;
  undefined1 *local_16a8;
  undefined1 *local_16a0;
  char *local_1698;
  char *local_1690;
  char *local_1688;
  char *local_1680;
  undefined1 *local_1678;
  undefined1 *local_1670;
  char *local_1668;
  char *local_1660;
  char *local_1658;
  char *local_1650;
  undefined1 *local_1648;
  undefined1 *local_1640;
  char *local_1638;
  char *local_1630;
  char *local_1628;
  char *local_1620;
  undefined1 *local_1618;
  undefined1 *local_1610;
  char *local_1608;
  char *local_1600;
  char *local_15f8;
  char *local_15f0;
  undefined1 *local_15e8;
  undefined1 *local_15e0;
  char *local_15d8;
  char *local_15d0;
  char *local_15c8;
  char *local_15c0;
  undefined1 *local_15b8;
  undefined1 *local_15b0;
  char *local_15a8;
  char *local_15a0;
  char *local_1598;
  char *local_1590;
  undefined1 *local_1588;
  undefined1 *local_1580;
  char *local_1578;
  char *local_1570;
  char *local_1568;
  char *local_1560;
  undefined1 *local_1558;
  undefined1 *local_1550;
  char *local_1548;
  char *local_1540;
  char *local_1538;
  char *local_1530;
  undefined1 *local_1528;
  undefined1 *local_1520;
  char *local_1518;
  char *local_1510;
  char *local_1508;
  char *local_1500;
  undefined1 *local_14f8;
  undefined1 *local_14f0;
  char *local_14e8;
  char *local_14e0;
  char *local_14d8;
  char *local_14d0;
  undefined1 *local_14c8;
  undefined1 *local_14c0;
  char *local_14b8;
  char *local_14b0;
  char *local_14a8;
  char *local_14a0;
  undefined1 *local_1498;
  undefined1 *local_1490;
  char *local_1488;
  char *local_1480;
  char *local_1478;
  char *local_1470;
  undefined1 *local_1468;
  undefined1 *local_1460;
  char *local_1458;
  char *local_1450;
  char *local_1448;
  char *local_1440;
  undefined1 *local_1438;
  undefined1 *local_1430;
  char *local_1428;
  char *local_1420;
  char *local_1418;
  char *local_1410;
  undefined1 *local_1408;
  undefined1 *local_1400;
  char *local_13f8;
  char *local_13f0;
  char *local_13e8;
  char *local_13e0;
  undefined1 *local_13d8;
  undefined1 *local_13d0;
  char *local_13c8;
  char *local_13c0;
  char *local_13b8;
  char *local_13b0;
  undefined1 *local_13a8;
  undefined1 *local_13a0;
  char *local_1398;
  char *local_1390;
  char *local_1388;
  char *local_1380;
  undefined1 *local_1378;
  undefined1 *local_1370;
  char *local_1368;
  char *local_1360;
  char *local_1358;
  char *local_1350;
  undefined1 *local_1348;
  undefined1 *local_1340;
  char *local_1338;
  char *local_1330;
  char *local_1328;
  char *local_1320;
  undefined1 *local_1318;
  undefined1 *local_1310;
  char *local_1308;
  char *local_1300;
  char *local_12f8;
  char *local_12f0;
  undefined1 *local_12e8;
  undefined1 *local_12e0;
  char *local_12d8;
  char *local_12d0;
  char *local_12c8;
  char *local_12c0;
  undefined1 *local_12b8;
  undefined1 *local_12b0;
  char *local_12a8;
  char *local_12a0;
  char *local_1298;
  char *local_1290;
  undefined1 *local_1288;
  undefined1 *local_1280;
  char *local_1278;
  char *local_1270;
  char *local_1268;
  char *local_1260;
  undefined1 *local_1258;
  undefined1 *local_1250;
  char *local_1248;
  char *local_1240;
  char *local_1238;
  char *local_1230;
  undefined1 *local_1228;
  undefined1 *local_1220;
  char *local_1218;
  char *local_1210;
  char *local_1208;
  char *local_1200;
  undefined1 *local_11f8;
  undefined1 *local_11f0;
  char *local_11e8;
  char *local_11e0;
  char *local_11d8;
  char *local_11d0;
  undefined1 *local_11c8;
  undefined1 *local_11c0;
  char *local_11b8;
  char *local_11b0;
  char *local_11a8;
  char *local_11a0;
  undefined1 *local_1198;
  undefined1 *local_1190;
  char *local_1188;
  char *local_1180;
  char *local_1178;
  char *local_1170;
  undefined1 *local_1168;
  undefined1 *local_1160;
  char *local_1158;
  char *local_1150;
  char *local_1148;
  char *local_1140;
  undefined1 *local_1138;
  undefined1 *local_1130;
  char *local_1128;
  char *local_1120;
  char *local_1118;
  char *local_1110;
  undefined1 *local_1108;
  undefined1 *local_1100;
  char *local_10f8;
  char *local_10f0;
  char *local_10e8;
  char *local_10e0;
  undefined1 *local_10d8;
  undefined1 *local_10d0;
  char *local_10c8;
  char *local_10c0;
  char *local_10b8;
  char *local_10b0;
  undefined1 *local_10a8;
  undefined1 *local_10a0;
  char *local_1098;
  char *local_1090;
  char *local_1088;
  char *local_1080;
  undefined1 *local_1078;
  undefined1 *local_1070;
  char *local_1068;
  char *local_1060;
  char *local_1058;
  char *local_1050;
  undefined1 *local_1048;
  undefined1 *local_1040;
  char *local_1038;
  char *local_1030;
  char *local_1028;
  char *local_1020;
  undefined1 *local_1018;
  undefined1 *local_1010;
  char *local_1008;
  char *local_1000;
  char *local_ff8;
  char *local_ff0;
  undefined1 *local_fe8;
  undefined1 *local_fe0;
  char *local_fd8;
  char *local_fd0;
  char *local_fc8;
  char *local_fc0;
  undefined1 *local_fb8;
  undefined1 *local_fb0;
  char *local_fa8;
  char *local_fa0;
  char *local_f98;
  char *local_f90;
  undefined1 *local_f88;
  undefined1 *local_f80;
  char *local_f78;
  char *local_f70;
  char *local_f68;
  char *local_f60;
  undefined1 *local_f58;
  undefined1 *local_f50;
  char *local_f48;
  char *local_f40;
  char *local_f38;
  char *local_f30;
  undefined1 *local_f28;
  undefined1 *local_f20;
  char *local_f18;
  char *local_f10;
  char *local_f08;
  char *local_f00;
  undefined1 *local_ef8;
  undefined1 *local_ef0;
  char *local_ee8;
  char *local_ee0;
  char *local_ed8;
  char *local_ed0;
  undefined1 *local_ec8;
  undefined1 *local_ec0;
  char *local_eb8;
  char *local_eb0;
  char *local_ea8;
  char *local_ea0;
  undefined1 *local_e98;
  undefined1 *local_e90;
  char *local_e88;
  char *local_e80;
  char *local_e78;
  char *local_e70;
  undefined1 *local_e68;
  undefined1 *local_e60;
  char *local_e58;
  char *local_e50;
  char *local_e48;
  char *local_e40;
  undefined1 *local_e38;
  undefined1 *local_e30;
  char *local_e28;
  char *local_e20;
  char *local_e18;
  char *local_e10;
  undefined1 *local_e08;
  undefined1 *local_e00;
  char *local_df8;
  char *local_df0;
  char *local_de8;
  char *local_de0;
  undefined1 *local_dd8;
  undefined1 *local_dd0;
  char *local_dc8;
  char *local_dc0;
  char *local_db8;
  char *local_db0;
  undefined1 *local_da8;
  undefined1 *local_da0;
  char *local_d98;
  char *local_d90;
  char *local_d88;
  char *local_d80;
  undefined1 *local_d78;
  undefined1 *local_d70;
  char *local_d68;
  char *local_d60;
  char *local_d58;
  char *local_d50;
  undefined1 *local_d48;
  undefined1 *local_d40;
  char *local_d38;
  char *local_d30;
  char *local_d28;
  char *local_d20;
  undefined1 *local_d18;
  undefined1 *local_d10;
  char *local_d08;
  char *local_d00;
  char *local_cf8;
  char *local_cf0;
  undefined1 *local_ce8;
  undefined1 *local_ce0;
  char *local_cd8;
  char *local_cd0;
  char *local_cc8;
  char *local_cc0;
  undefined1 *local_cb8;
  undefined1 *local_cb0;
  char *local_ca8;
  char *local_ca0;
  char *local_c98;
  char *local_c90;
  undefined1 *local_c88;
  undefined1 *local_c80;
  char *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  undefined1 *local_c58;
  undefined1 *local_c50;
  char *local_c48;
  char *local_c40;
  char *local_c38;
  char *local_c30;
  undefined1 *local_c28;
  undefined1 *local_c20;
  char *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  char *local_be8;
  char *local_be0;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  optional<wallet::SelectionResult> result23;
  optional<wallet::SelectionResult> result22;
  optional<wallet::SelectionResult> result21;
  optional<wallet::SelectionResult> result20;
  optional<wallet::SelectionResult> result19;
  optional<wallet::SelectionResult> result18;
  optional<wallet::SelectionResult> result17;
  optional<wallet::SelectionResult> result16;
  optional<wallet::SelectionResult> result15;
  optional<wallet::SelectionResult> result14;
  optional<wallet::SelectionResult> result13;
  optional<wallet::SelectionResult> result12;
  optional<wallet::SelectionResult> result11;
  optional<wallet::SelectionResult> result10;
  optional<wallet::SelectionResult> result9;
  optional<wallet::SelectionResult> result8;
  optional<wallet::SelectionResult> result7;
  optional<wallet::SelectionResult> result6;
  optional<wallet::SelectionResult> result5;
  optional<wallet::SelectionResult> result4;
  optional<wallet::SelectionResult> result3;
  optional<wallet::SelectionResult> result2;
  optional<wallet::SelectionResult> result1;
  CoinsResult available_coins;
  FastRandomContext rand;
  
  local_1030 = (char *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&rand,false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result1,"",(allocator<char> *)&result2);
  NewWallet((NodeContext *)&wallet,
            (string *)
            &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node);
  std::__cxx11::string::~string((string *)&result1);
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = 0;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  available_coins.total_amount = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  iVar13 = 0;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (iVar13 != 100) {
    CoinsResult::Clear(&available_coins);
    local_be8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_be0 = "";
    local_bf8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = (iterator)in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x1ff;
    file.m_begin = (iterator)&local_be8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_bf8,msg);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_standard);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    _cVar17 = 0x61917e;
    KnapsackSolver(&result1,pvVar3,(CAmount *)&result5,1000000,&rand);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         CONCAT71(result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_payload._1_7_,
                  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_engaged) ^ 1;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d19b0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 1 * CENT, CENT)"
         + 0x60;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result4;
    local_c08 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_c00 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result3,(lazy_ostream *)&result2,1,0,WARN,_cVar17,
               (size_t)&local_c08,0x1ff);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result3.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result1);
    result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    pvVar7 = (iterator)0x4;
    pvVar8 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result1,
             (CFeeRate)0x0,4,false,0,false,in_stack_ffffffffffffe4d8);
    local_c18 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_c10 = "";
    local_c28 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar8;
    msg_00.m_begin = pvVar7;
    file_00.m_end = (iterator)0x204;
    file_00.m_begin = (iterator)&local_c18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c28,
               msg_00);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_standard);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    _cVar17 = 0x61932d;
    KnapsackSolver(&result1,pvVar3,(CAmount *)&result5,1000000,&rand);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         CONCAT71(result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_payload._1_7_,
                  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_engaged) ^ 1;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d19b0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 1 * CENT, CENT)"
         + 0x60;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result4;
    local_c38 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_c30 = "";
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result3,(lazy_ostream *)&result2,1,0,WARN,_cVar17,
               (size_t)&local_c38,0x204);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result3.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result1);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    pFVar9 = &rand;
    KnapsackSolver(&result1,pvVar3,(CAmount *)&result2,1000000,pFVar9);
    local_c48 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_c40 = "";
    local_c58 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x619494;
    msg_01.m_end = pvVar7;
    msg_01.m_begin = (iterator)pFVar9;
    file_01.m_end = (iterator)0x208;
    file_01.m_begin = (iterator)&local_c48;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_c58,
               msg_01);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_51a0ef;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result1" + 7;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result4;
    local_c68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_c60 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result3,(lazy_ostream *)&result2,1,0,WARN,_cVar17,
               (size_t)&local_c68,0x208);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result3.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_c78 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_c70 = "";
    local_c88 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c80 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = pvVar8;
    msg_02.m_begin = pvVar7;
    file_02.m_end = (iterator)0x209;
    file_02.m_begin = (iterator)&local_c78;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_c88,
               msg_02);
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_c98 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_c90 = "";
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result1);
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result2,&local_c98,0x209,1,2,&result3,"result1->GetSelectedValue()",&result4,
               "1 * CENT");
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 2000000;
    pvVar7 = (iterator)0x90;
    pvVar8 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result2,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    local_ca8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_ca0 = "";
    local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_03.m_end = pvVar8;
    msg_03.m_begin = pvVar7;
    file_03.m_end = (iterator)0x20e;
    file_03.m_begin = (iterator)&local_ca8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_cb8,
               msg_03);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_standard);
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 3000000;
    _cVar17 = 0x61971b;
    KnapsackSolver(&result2,pvVar3,(CAmount *)&result6,1000000,&rand);
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         CONCAT71(result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_payload._1_7_,
                  result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_engaged) ^ 1;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d19ca;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 3 * CENT, CENT)"
         + 0x60;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result5;
    local_cc8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_cc0 = "";
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result4,(lazy_ostream *)&result3,1,0,WARN,_cVar17,
               (size_t)&local_cc8,0x20e);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result4.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result2);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 3000000;
    pFVar9 = &rand;
    KnapsackSolver(&result2,pvVar3,(CAmount *)&result3,1000000,pFVar9);
    local_cd8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_cd0 = "";
    local_ce8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ce0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = pvVar7;
    msg_04.m_begin = (iterator)pFVar9;
    file_04.m_end = (iterator)0x212;
    file_04.m_begin = (iterator)&local_cd8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_ce8,
               msg_04);
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_51a11c;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result2" + 7;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result5;
    local_cf8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_cf0 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result4,(lazy_ostream *)&result3,1,0,WARN,CHECK_MSG,
               (size_t)&local_cf8,0x212);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result4.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_d08 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_d00 = "";
    local_d18 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d10 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = pvVar8;
    msg_05.m_begin = pvVar7;
    file_05.m_end = (iterator)0x213;
    file_05.m_begin = (iterator)&local_d08;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_d18,
               msg_05);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_d28 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_d20 = "";
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result2);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 3000000;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result3,&local_d28,0x213,1,2,&result4,"result2->GetSelectedValue()",&result5,
               "3 * CENT");
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 5000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result3,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 10000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result3,
             (CFeeRate)0x0,3,true,0,false,iVar13);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 20000000;
    pvVar7 = (iterator)0x90;
    pvVar8 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result3,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    local_d38 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_d30 = "";
    local_d48 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d40 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = pvVar8;
    msg_06.m_begin = pvVar7;
    file_06.m_end = (iterator)0x21c;
    file_06.m_begin = (iterator)&local_d38;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_d48,
               msg_06);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_standard);
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 38000000;
    _cVar17 = 0x619b6d;
    KnapsackSolver(&result3,pvVar3,(CAmount *)&result7,1000000,&rand);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         CONCAT71(result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_payload._1_7_,
                  result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_engaged) ^ 1;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d19e2;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 38 * CENT, CENT)"
         + 0x61;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result6;
    local_d58 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_d50 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result5,(lazy_ostream *)&result4,1,0,WARN,_cVar17,
               (size_t)&local_d58,0x21c);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result5.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result3);
    local_d68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_d60 = "";
    local_d78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_07.m_end = pvVar8;
    msg_07.m_begin = pvVar7;
    file_07.m_end = (iterator)0x21e;
    file_07.m_begin = (iterator)&local_d68;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_d78,
               msg_07);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_standard_extra);
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 38000000;
    _cVar17 = 0x619cd7;
    KnapsackSolver(&result3,pvVar3,(CAmount *)&result7,1000000,&rand);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         CONCAT71(result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_payload._1_7_,
                  result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_engaged) ^ 1;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d19ee;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard_extra), 38 * CENT, CENT)"
         + 0x67;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result6;
    local_d88 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_d80 = "";
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result5,(lazy_ostream *)&result4,1,0,WARN,_cVar17,
               (size_t)&local_d88,0x21e);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result5.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result3);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_standard);
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 37000000;
    pFVar9 = &rand;
    KnapsackSolver(&result3,pvVar3,(CAmount *)&result4,1000000,pFVar9);
    local_d98 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_d90 = "";
    local_da8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_da0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x619e3b;
    msg_08.m_end = pvVar7;
    msg_08.m_begin = (iterator)pFVar9;
    file_08.m_end = (iterator)0x221;
    file_08.m_begin = (iterator)&local_d98;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_da8,
               msg_08);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1715;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result3" + 7;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result6;
    local_db8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_db0 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result5,(lazy_ostream *)&result4,1,0,WARN,_cVar17,
               (size_t)&local_db8,0x221);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result5.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_dc8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_dc0 = "";
    local_dd8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_dd0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_09.m_end = pvVar8;
    msg_09.m_begin = pvVar7;
    file_09.m_end = (iterator)0x222;
    file_09.m_begin = (iterator)&local_dc8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_dd8,
               msg_09);
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_de8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_de0 = "";
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result3);
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 37000000;
    poVar11 = &result5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result4,&local_de8,0x222,1,2,poVar11,"result3->GetSelectedValue()",&result6,
               "37 * CENT");
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 38000000;
    pFVar9 = &rand;
    KnapsackSolver(&result4,pvVar3,(CAmount *)&result5,1000000,pFVar9);
    local_df8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_df0 = "";
    local_e08 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e00 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61a08b;
    msg_10.m_end = (iterator)poVar11;
    msg_10.m_begin = (iterator)pFVar9;
    file_10.m_end = (iterator)0x225;
    file_10.m_begin = (iterator)&local_df8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_e08,
               msg_10);
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d175a;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result4" + 7;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result7;
    local_e18 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_e10 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result6,(lazy_ostream *)&result5,1,0,WARN,_cVar17,
               (size_t)&local_e18,0x225);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result6.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_e28 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_e20 = "";
    local_e38 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e30 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_11.m_end = pvVar8;
    msg_11.m_begin = pvVar7;
    file_11.m_end = (iterator)0x226;
    file_11.m_begin = (iterator)&local_e28;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_e38,
               msg_11);
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_e48 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_e40 = "";
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result4);
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 38000000;
    poVar11 = &result6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result5,&local_e48,0x226,1,2,poVar11,"result4->GetSelectedValue()",&result7,
               "38 * CENT");
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 34000000;
    pFVar9 = &rand;
    KnapsackSolver(&result5,pvVar3,(CAmount *)&result6,1000000,pFVar9);
    local_e58 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_e50 = "";
    local_e68 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e60 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61a2db;
    msg_12.m_end = (iterator)poVar11;
    msg_12.m_begin = (iterator)pFVar9;
    file_12.m_end = (iterator)0x22a;
    file_12.m_begin = (iterator)&local_e58;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_e68,
               msg_12);
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1794;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result5" + 7;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result8;
    local_e78 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_e70 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result7,(lazy_ostream *)&result6,1,0,WARN,_cVar17,
               (size_t)&local_e78,0x22a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result7.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_e88 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_e80 = "";
    local_e98 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e90 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_13.m_end = pvVar8;
    msg_13.m_begin = pvVar7;
    file_13.m_end = (iterator)0x22b;
    file_13.m_begin = (iterator)&local_e88;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_e98,
               msg_13);
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_ea8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_ea0 = "";
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result5);
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 35000000;
    pvVar7 = (iterator)0x2;
    poVar11 = &result7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result6,&local_ea8,0x22b,1,2,poVar11,"result5->GetSelectedValue()",&result8,
               "35 * CENT");
    local_eb8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_eb0 = "";
    local_ec8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ec0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_14.m_end = (iterator)poVar11;
    msg_14.m_begin = pvVar7;
    file_14.m_end = (iterator)0x22c;
    file_14.m_begin = (iterator)&local_eb8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_ec8,
               msg_14);
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_ed8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_ed0 = "";
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result5);
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 3;
    poVar11 = &result7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result6,&local_ed8,0x22c,1,2,poVar11,"result5->GetInputSet().size()",&result8,"3U");
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 7000000;
    pFVar9 = &rand;
    KnapsackSolver(&result6,pvVar3,(CAmount *)&result7,1000000,pFVar9);
    local_ee8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_ee0 = "";
    local_ef8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ef0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61a62d;
    msg_15.m_end = (iterator)poVar11;
    msg_15.m_begin = (iterator)pFVar9;
    file_15.m_end = (iterator)0x230;
    file_15.m_begin = (iterator)&local_ee8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_ef8,
               msg_15);
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1a60;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result6" + 7;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result9;
    local_f08 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_f00 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result8,(lazy_ostream *)&result7,1,0,WARN,_cVar17,
               (size_t)&local_f08,0x230);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result8.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_f18 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_f10 = "";
    local_f28 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f20 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_16.m_end = pvVar8;
    msg_16.m_begin = pvVar7;
    file_16.m_end = (iterator)0x231;
    file_16.m_begin = (iterator)&local_f18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_f28,
               msg_16);
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_f38 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_f30 = "";
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result6);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 7000000;
    pvVar7 = (iterator)0x2;
    poVar11 = &result8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result7,&local_f38,0x231,1,2,poVar11,"result6->GetSelectedValue()",&result9,
               "7 * CENT");
    local_f48 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_f40 = "";
    local_f58 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f50 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_17.m_end = (iterator)poVar11;
    msg_17.m_begin = pvVar7;
    file_17.m_end = (iterator)0x232;
    file_17.m_begin = (iterator)&local_f48;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_f58,
               msg_17);
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_f68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_f60 = "";
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result6);
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 2;
    poVar11 = &result8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result7,&local_f68,0x232,1,2,poVar11,"result6->GetInputSet().size()",&result9,"2U");
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 8000000;
    pFVar9 = &rand;
    KnapsackSolver(&result7,pvVar3,(CAmount *)&result8,1000000,pFVar9);
    local_f78 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_f70 = "";
    local_f88 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f80 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61a97f;
    msg_18.m_end = (iterator)poVar11;
    msg_18.m_begin = (iterator)pFVar9;
    file_18.m_end = (iterator)0x236;
    file_18.m_begin = (iterator)&local_f78;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_f88,
               msg_18);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1806;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result7" + 7;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_f98 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_f90 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)(_Optional_payload_base<wallet::SelectionResult> *)&result10;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result9,(lazy_ostream *)&result8,1,0,WARN,_cVar17,
               (size_t)&local_f98,0x236);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result9.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_fa8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_fa0 = "";
    local_fb8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_fb0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_19.m_end = pvVar8;
    msg_19.m_begin = pvVar7;
    file_19.m_end = (iterator)0x237;
    file_19.m_begin = (iterator)&local_fa8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_fb8,
               msg_19);
    _cVar17 = 0x61aa8d;
    CVar5 = SelectionResult::GetSelectedValue((SelectionResult *)&result7);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ = CVar5 == 8000000;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1a9c;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)"result7->GetSelectedValue() == 8 * CENT" + 0x27;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_fc8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_fc0 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)(_Optional_payload_base<wallet::SelectionResult> *)&result10;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result9,(lazy_ostream *)&result8,1,0,WARN,_cVar17,
               (size_t)&local_fc8,0x237);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result9.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_fd8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_fd0 = "";
    local_fe8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_fe0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_20.m_end = pvVar8;
    msg_20.m_begin = pvVar7;
    file_20.m_end = (iterator)0x238;
    file_20.m_begin = (iterator)&local_fd8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_fe8,
               msg_20);
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_ff8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_ff0 = "";
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result7);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 3;
    poVar11 = &result9;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result8,&local_ff8,0x238,1,2,&result9,"result7->GetInputSet().size()",
               (_Optional_payload_base<wallet::SelectionResult> *)&result10,"3U");
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 9000000;
    pFVar9 = &rand;
    KnapsackSolver(&result8,pvVar3,(CAmount *)&result9,1000000,pFVar9);
    local_1008 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1000 = "";
    local_1018 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1010 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61acd5;
    msg_21.m_end = (iterator)poVar11;
    msg_21.m_begin = (iterator)pFVar9;
    file_21.m_end = (iterator)0x23c;
    file_21.m_begin = (iterator)&local_1008;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_1018,
               msg_21);
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1812;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result8" + 7;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result11;
    local_1028 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1020 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result10,(lazy_ostream *)&result9,1,0,WARN,_cVar17,
               (size_t)&local_1028,0x23c);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result10.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1038 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1030 = "";
    local_1048 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1040 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_22.m_end = pvVar8;
    msg_22.m_begin = pvVar7;
    file_22.m_end = (iterator)0x23d;
    file_22.m_begin = (iterator)&local_1038;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_1048,
               msg_22);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1058 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1050 = "";
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result8);
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 10000000;
    pvVar7 = (iterator)0x2;
    p_Var10 = (_Optional_payload_base<wallet::SelectionResult> *)&result10;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result9,&local_1058,0x23d,1,2,
               (_Optional_payload_base<wallet::SelectionResult> *)&result10,
               "result8->GetSelectedValue()",&result11,"10 * CENT");
    local_1068 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1060 = "";
    local_1078 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1070 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_23.m_end = (iterator)p_Var10;
    msg_23.m_begin = pvVar7;
    file_23.m_end = (iterator)0x23e;
    file_23.m_begin = (iterator)&local_1068;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_1078,
               msg_23);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1088 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1080 = "";
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result8);
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result9,&local_1088,0x23e,1,2,
               (_Optional_payload_base<wallet::SelectionResult> *)&result10,
               "result8->GetInputSet().size()",&result11,"1U");
    CoinsResult::Clear(&available_coins);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 6000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result9,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 7000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result9,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 8000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result9,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 20000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result9,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 30000000;
    pvVar7 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result9,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 71000000;
    pFVar9 = &rand;
    KnapsackSolver(&result9,pvVar3,(CAmount *)&result10,1000000,pFVar9);
    local_1098 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1090 = "";
    local_10a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_10a0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61b10e;
    msg_24.m_end = pvVar7;
    msg_24.m_begin = (iterator)pFVar9;
    file_24.m_end = (iterator)0x24b;
    file_24.m_begin = (iterator)&local_1098;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_10a8,
               msg_24);
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result9.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1876;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result9" + 7;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result12;
    local_10b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_10b0 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result11,(lazy_ostream *)&result10,1,0,WARN,_cVar17,
               (size_t)&local_10b8,0x24b);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result11.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_10c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_10c0 = "";
    local_10d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_10d0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_25.m_end = pvVar8;
    msg_25.m_begin = pvVar7;
    file_25.m_end = (iterator)0x24c;
    file_25.m_begin = (iterator)&local_10c8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_10d8,
               msg_25);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 72000000;
    _cVar17 = 0x61b258;
    KnapsackSolver(&result10,pvVar3,(CAmount *)&result14,1000000,&rand);
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         CONCAT71(result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_payload._1_7_,
                  result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                  super__Optional_payload_base<wallet::SelectionResult>._M_engaged) ^ 1;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1acc;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)
         "!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 72 * CENT, CENT)"
         + 0x62;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result13;
    local_10e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_10e0 = "";
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result12,(lazy_ostream *)&result11,1,0,WARN,_cVar17,
               (size_t)&local_10e8,0x24c);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result12.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result10);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 16000000;
    pFVar9 = &rand;
    KnapsackSolver(&result10,pvVar3,(CAmount *)&result11,1000000,pFVar9);
    local_10f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_10f0 = "";
    local_1108 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1100 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61b3bc;
    msg_26.m_end = pvVar7;
    msg_26.m_begin = (iterator)pFVar9;
    file_26.m_end = (iterator)0x250;
    file_26.m_begin = (iterator)&local_10f8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_1108,
               msg_26);
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result10.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d189a;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result10" + 8;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result13;
    local_1118 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1110 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result12,(lazy_ostream *)&result11,1,0,WARN,_cVar17,
               (size_t)&local_1118,0x250);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result12.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1128 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1120 = "";
    local_1138 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1130 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_27.m_end = pvVar8;
    msg_27.m_begin = pvVar7;
    file_27.m_end = (iterator)0x251;
    file_27.m_begin = (iterator)&local_1128;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_1138,
               msg_27);
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1148 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1140 = "";
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result10);
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 20000000;
    pvVar7 = (iterator)0x2;
    poVar11 = &result12;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result11,&local_1148,0x251,1,2,poVar11,"result10->GetSelectedValue()",&result13,
               "20 * CENT");
    local_1158 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1150 = "";
    local_1168 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1160 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_28.m_end = (iterator)poVar11;
    msg_28.m_begin = pvVar7;
    file_28.m_end = (iterator)0x252;
    file_28.m_begin = (iterator)&local_1158;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_1168,
               msg_28);
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1178 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1170 = "";
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result10);
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result11,&local_1178,0x252,1,2,&result12,"result10->GetInputSet().size()",&result13,
               "1U");
    result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 5000000;
    pvVar7 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result11,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 16000000;
    pFVar9 = &rand;
    KnapsackSolver(&result11,pvVar3,(CAmount *)&result12,1000000,pFVar9);
    local_1188 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1180 = "";
    local_1198 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1190 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61b732;
    msg_29.m_end = pvVar7;
    msg_29.m_begin = (iterator)pFVar9;
    file_29.m_end = (iterator)0x258;
    file_29.m_begin = (iterator)&local_1188;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_1198,
               msg_29);
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result11.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1b26;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result11" + 8;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result14;
    local_11a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_11a0 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result13,(lazy_ostream *)&result12,1,0,WARN,_cVar17,
               (size_t)&local_11a8,600);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result13.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_11b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_11b0 = "";
    local_11c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_11c0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_30.m_end = pvVar8;
    msg_30.m_begin = pvVar7;
    file_30.m_end = (iterator)0x259;
    file_30.m_begin = (iterator)&local_11b8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_11c8,
               msg_30);
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_11d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_11d0 = "";
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result11);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 18000000;
    pvVar7 = (iterator)0x2;
    poVar11 = &result13;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result12,&local_11d8,0x259,1,2,poVar11,"result11->GetSelectedValue()",&result14,
               "18 * CENT");
    local_11e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_11e0 = "";
    local_11f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_11f0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_31.m_end = (iterator)poVar11;
    msg_31.m_begin = pvVar7;
    file_31.m_end = (iterator)0x25a;
    file_31.m_begin = (iterator)&local_11e8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_11f8,
               msg_31);
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1208 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1200 = "";
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result11);
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result12,&local_1208,0x25a,1,2,&result13,"result11->GetInputSet().size()",&result14,
               "3U");
    result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 18000000;
    pvVar7 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result12,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 16000000;
    pFVar9 = &rand;
    KnapsackSolver(&result12,pvVar3,(CAmount *)&result13,1000000,pFVar9);
    local_1218 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1210 = "";
    local_1228 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1220 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61bab2;
    msg_32.m_end = pvVar7;
    msg_32.m_begin = (iterator)pFVar9;
    file_32.m_end = (iterator)0x260;
    file_32.m_begin = (iterator)&local_1218;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_1228,
               msg_32);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result12.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1b56;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result12" + 8;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result15;
    local_1238 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1230 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result14,(lazy_ostream *)&result13,1,0,WARN,_cVar17,
               (size_t)&local_1238,0x260);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result14.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1248 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1240 = "";
    local_1258 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1250 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_33.m_end = pvVar8;
    msg_33.m_begin = pvVar7;
    file_33.m_end = (iterator)0x261;
    file_33.m_begin = (iterator)&local_1248;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_1258,
               msg_33);
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1268 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1260 = "";
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result12);
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 18000000;
    pvVar7 = (iterator)0x2;
    poVar11 = &result14;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result13,&local_1268,0x261,1,2,poVar11,"result12->GetSelectedValue()",&result15,
               "18 * CENT");
    local_1278 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1270 = "";
    local_1288 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1280 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_34.m_end = (iterator)poVar11;
    msg_34.m_begin = pvVar7;
    file_34.m_end = (iterator)0x262;
    file_34.m_begin = (iterator)&local_1278;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_1288,
               msg_34);
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1298 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1290 = "";
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result12);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 1;
    poVar11 = &result14;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result13,&local_1298,0x262,1,2,&result14,"result12->GetInputSet().size()",&result15,
               "1U");
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 11000000;
    pFVar9 = &rand;
    KnapsackSolver(&result13,pvVar3,(CAmount *)&result14,1000000,pFVar9);
    local_12a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_12a0 = "";
    local_12b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_12b0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61be02;
    msg_35.m_end = (iterator)poVar11;
    msg_35.m_begin = (iterator)pFVar9;
    file_35.m_end = (iterator)0x266;
    file_35.m_begin = (iterator)&local_12a8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_12b8,
               msg_35);
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result13.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1b7a;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result13" + 8;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result16;
    local_12c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_12c0 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result15,(lazy_ostream *)&result14,1,0,WARN,_cVar17,
               (size_t)&local_12c8,0x266);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result15.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_12d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_12d0 = "";
    local_12e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_12e0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_36.m_end = pvVar8;
    msg_36.m_begin = pvVar7;
    file_36.m_end = (iterator)0x267;
    file_36.m_begin = (iterator)&local_12d8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_12e8,
               msg_36);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_12f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_12f0 = "";
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result13);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 11000000;
    pvVar7 = (iterator)0x2;
    poVar11 = &result15;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result14,&local_12f8,0x267,1,2,poVar11,"result13->GetSelectedValue()",&result16,
               "11 * CENT");
    local_1308 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1300 = "";
    local_1318 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1310 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_37.m_end = (iterator)poVar11;
    msg_37.m_begin = pvVar7;
    file_37.m_end = (iterator)0x268;
    file_37.m_begin = (iterator)&local_1308;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_1318,
               msg_37);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1328 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1320 = "";
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result13);
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result14,&local_1328,0x268,1,2,&result15,"result13->GetInputSet().size()",&result16,
               "2U");
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 100000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result14,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 200000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result14,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 300000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result14,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 400000000;
    pvVar7 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result14,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 95000000;
    pFVar9 = &rand;
    KnapsackSolver(&result14,pvVar3,(CAmount *)&result15,1000000,pFVar9);
    local_1338 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1330 = "";
    local_1348 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1340 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61c212;
    msg_38.m_end = pvVar7;
    msg_38.m_begin = (iterator)pFVar9;
    file_38.m_end = (iterator)0x270;
    file_38.m_begin = (iterator)&local_1338;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_1348,
               msg_38);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result14.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1baa;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result14" + 8;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result17;
    local_1358 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1350 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result16,(lazy_ostream *)&result15,1,0,WARN,_cVar17,
               (size_t)&local_1358,0x270);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result16.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1368 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1360 = "";
    local_1378 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1370 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_39.m_end = pvVar8;
    msg_39.m_begin = pvVar7;
    file_39.m_end = (iterator)0x271;
    file_39.m_begin = (iterator)&local_1368;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_1378,
               msg_39);
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1388 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1380 = "";
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result14);
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 100000000;
    pvVar7 = (iterator)0x2;
    poVar11 = &result16;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result15,&local_1388,0x271,1,2,poVar11,"result14->GetSelectedValue()",&result17,
               "1 * COIN");
    local_1398 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1390 = "";
    local_13a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_13a0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_40.m_end = (iterator)poVar11;
    msg_40.m_begin = pvVar7;
    file_40.m_end = (iterator)0x272;
    file_40.m_begin = (iterator)&local_1398;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_13a8,
               msg_40);
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_13b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_13b0 = "";
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result14);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 1;
    poVar11 = &result16;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result15,&local_13b8,0x272,1,2,&result16,"result14->GetInputSet().size()",&result17,
               "1U");
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 195000000;
    pFVar9 = &rand;
    KnapsackSolver(&result15,pvVar3,(CAmount *)&result16,1000000,pFVar9);
    local_13c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_13c0 = "";
    local_13d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_13d0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61c562;
    msg_41.m_end = (iterator)poVar11;
    msg_41.m_begin = (iterator)pFVar9;
    file_41.m_end = (iterator)0x275;
    file_41.m_begin = (iterator)&local_13c8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_13d8,
               msg_41);
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result15.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1bda;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result15" + 8;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result18;
    local_13e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_13e0 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result17,(lazy_ostream *)&result16,1,0,WARN,_cVar17,
               (size_t)&local_13e8,0x275);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result17.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_13f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_13f0 = "";
    local_1408 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1400 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_42.m_end = pvVar8;
    msg_42.m_begin = pvVar7;
    file_42.m_end = (iterator)0x276;
    file_42.m_begin = (iterator)&local_13f8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_1408,
               msg_42);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1418 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1410 = "";
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result15);
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 200000000;
    pvVar7 = (iterator)0x2;
    poVar11 = &result17;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result16,&local_1418,0x276,1,2,poVar11,"result15->GetSelectedValue()",&result18,
               "2 * COIN");
    local_1428 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1420 = "";
    local_1438 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1430 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_43.m_end = (iterator)poVar11;
    msg_43.m_begin = pvVar7;
    file_43.m_end = (iterator)0x277;
    file_43.m_begin = (iterator)&local_1428;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_1438,
               msg_43);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1448 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1440 = "";
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result15);
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result16,&local_1448,0x277,1,2,&result17,"result15->GetInputSet().size()",&result18,
               "1U");
    CoinsResult::Clear(&available_coins);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 100000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result16,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 200000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result16,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 300000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result16,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 400000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result16,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 500000;
    pvVar7 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result16,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    pFVar9 = &rand;
    KnapsackSolver(&result16,pvVar3,&CENT,1000000,pFVar9);
    local_1458 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1450 = "";
    local_1468 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1460 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61c9a2;
    msg_44.m_end = pvVar7;
    msg_44.m_begin = (iterator)pFVar9;
    file_44.m_end = (iterator)0x285;
    file_44.m_begin = (iterator)&local_1458;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_1468,
               msg_44);
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result16.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1c0a;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result16" + 8;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result19;
    local_1478 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1470 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result18,(lazy_ostream *)&result17,1,0,WARN,_cVar17,
               (size_t)&local_1478,0x285);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result18.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1488 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1480 = "";
    local_1498 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1490 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_45.m_end = pvVar8;
    msg_45.m_begin = pvVar7;
    file_45.m_end = (iterator)0x286;
    file_45.m_begin = (iterator)&local_1488;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_1498,
               msg_45);
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_14a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_14a0 = "";
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result16);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result17,&local_14a8,0x286,1,2,&result18,"result16->GetSelectedValue()",&CENT,"CENT"
              );
    result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 0x423883c0;
    pvVar7 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result17,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    pFVar9 = &rand;
    KnapsackSolver(&result17,pvVar3,(CAmount *)&result18,1000000,pFVar9);
    local_14b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_14b0 = "";
    local_14c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_14c0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61cc13;
    msg_46.m_end = pvVar7;
    msg_46.m_begin = (iterator)pFVar9;
    file_46.m_end = (iterator)0x28d;
    file_46.m_begin = (iterator)&local_14b8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_14c8,
               msg_46);
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result17.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1c3c;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result17" + 8;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result20;
    local_14d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_14d0 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result19,(lazy_ostream *)&result18,1,0,WARN,_cVar17,
               (size_t)&local_14d8,0x28d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result19.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_14e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_14e0 = "";
    local_14f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_14f0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_47.m_end = pvVar8;
    msg_47.m_begin = pvVar7;
    file_47.m_end = (iterator)0x28e;
    file_47.m_begin = (iterator)&local_14e8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_14f8,
               msg_47);
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1508 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1500 = "";
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result17);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result18,&local_1508,0x28e,1,2,&result19,"result17->GetSelectedValue()",&result20,
               "1 * CENT");
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 600000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result18,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 700000;
    pvVar7 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result18,
             (CFeeRate)0x0,0x90,false,0,false,iVar13);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    pFVar9 = &rand;
    KnapsackSolver(&result18,pvVar3,(CAmount *)&result19,1000000,pFVar9);
    local_1518 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1510 = "";
    local_1528 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1520 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61cec1;
    msg_48.m_end = pvVar7;
    msg_48.m_begin = (iterator)pFVar9;
    file_48.m_end = (iterator)0x296;
    file_48.m_begin = (iterator)&local_1518;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_1528,
               msg_48);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result18.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1c54;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result18" + 8;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result21;
    local_1538 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1530 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result20,(lazy_ostream *)&result19,1,0,WARN,_cVar17,
               (size_t)&local_1538,0x296);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result20.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1548 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1540 = "";
    local_1558 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1550 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_49.m_end = pvVar8;
    msg_49.m_begin = pvVar7;
    file_49.m_end = (iterator)0x297;
    file_49.m_begin = (iterator)&local_1548;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_1558,
               msg_49);
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1568 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1560 = "";
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result18);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    poVar11 = &result20;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result19,&local_1568,0x297,1,2,poVar11,"result18->GetSelectedValue()",&result21,
               "1 * CENT");
    CoinsResult::Clear(&available_coins);
    iVar14 = 0x14;
    in_stack_ffffffffffffe4d8 = iVar13;
    while (bVar15 = iVar14 != 0, iVar14 = iVar14 + -1, bVar15) {
      result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 5000000000000;
      poVar11 = (optional<wallet::SelectionResult> *)0x0;
      add_coin(&available_coins,
               (CWallet *)
               wallet._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result19,
               (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
    }
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 50000000000000;
    pFVar9 = &rand;
    KnapsackSolver(&result19,pvVar3,(CAmount *)&result20,1000000,pFVar9);
    local_1578 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1570 = "";
    local_1588 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1580 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61d16b;
    msg_50.m_end = (iterator)poVar11;
    msg_50.m_begin = (iterator)pFVar9;
    file_50.m_end = (iterator)0x2a0;
    file_50.m_begin = (iterator)&local_1578;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_1588,
               msg_50);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result19.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1c6e;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result19" + 8;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result22;
    local_1598 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1590 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result21,(lazy_ostream *)&result20,1,0,WARN,_cVar17,
               (size_t)&local_1598,0x2a0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result21.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_15a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_15a0 = "";
    local_15b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_15b0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_51.m_end = pvVar8;
    msg_51.m_begin = pvVar7;
    file_51.m_end = (iterator)0x2a1;
    file_51.m_begin = (iterator)&local_15a8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_15b8,
               msg_51);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_15c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_15c0 = "";
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result19);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 50000000000000;
    pvVar7 = (iterator)0x2;
    poVar11 = &result21;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result20,&local_15c8,0x2a1,1,2,poVar11,"result19->GetSelectedValue()",&result22,
               "500000 * COIN");
    local_15d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_15d0 = "";
    local_15e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_15e0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_52.m_end = (iterator)poVar11;
    msg_52.m_begin = pvVar7;
    file_52.m_end = (iterator)0x2a2;
    file_52.m_begin = (iterator)&local_15d8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_15e8,
               msg_52);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_15f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_15f0 = "";
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result19);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 10;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result20,&local_15f8,0x2a2,1,2,&result21,"result19->GetInputSet().size()",&result22,
               "10U");
    CoinsResult::Clear(&available_coins);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 500000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result20,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 600000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result20,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 700000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result20,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
    result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 0x423883c0;
    pvVar7 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result20,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    pFVar9 = &rand;
    KnapsackSolver(&result20,pvVar3,(CAmount *)&result21,1000000,pFVar9);
    local_1608 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1600 = "";
    local_1618 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1610 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61d58e;
    msg_53.m_end = pvVar7;
    msg_53.m_begin = (iterator)pFVar9;
    file_53.m_end = (iterator)0x2ae;
    file_53.m_begin = (iterator)&local_1608;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_1618,
               msg_53);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result20.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1cbd;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result20" + 8;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result23;
    local_1628 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1620 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result22,(lazy_ostream *)&result21,1,0,WARN,_cVar17,
               (size_t)&local_1628,0x2ae);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result22.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_1638 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1630 = "";
    local_1648 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1640 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_54.m_end = pvVar8;
    msg_54.m_begin = pvVar7;
    file_54.m_end = (iterator)0x2af;
    file_54.m_begin = (iterator)&local_1638;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_1648,
               msg_54);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1658 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1650 = "";
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result20);
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 0x423883c0;
    pvVar7 = (iterator)0x2;
    poVar11 = &result22;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result21,&local_1658,0x2af,1,2,poVar11,"result20->GetSelectedValue()",&result23,
               "1111 * CENT");
    local_1668 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1660 = "";
    local_1678 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1670 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_55.m_end = (iterator)poVar11;
    msg_55.m_begin = pvVar7;
    file_55.m_end = (iterator)0x2b0;
    file_55.m_begin = (iterator)&local_1668;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_1678,
               msg_55);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1688 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1680 = "";
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result20);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result21,&local_1688,0x2b0,1,2,&result22,"result20->GetInputSet().size()",&result23,
               "1U");
    CoinsResult::Clear(&available_coins);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 400000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result21,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 600000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result21,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 800000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result21,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
    result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 0x423883c0;
    pvVar7 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result21,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    pFVar9 = &rand;
    KnapsackSolver(&result21,pvVar3,&CENT,1000000,pFVar9);
    local_1698 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1690 = "";
    local_16a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_16a0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61d99e;
    msg_56.m_end = pvVar7;
    msg_56.m_begin = (iterator)pFVar9;
    file_56.m_end = (iterator)0x2b9;
    file_56.m_begin = (iterator)&local_1698;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_16a8,
               msg_56);
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result21.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1800._0_8_ = "result21";
    local_1800._M_parent = (_Base_ptr)0xc7d3cf;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = &local_1800;
    local_16b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_16b0 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result23,(lazy_ostream *)&result22,1,0,WARN,_cVar17,
               (size_t)&local_16b8,0x2b9);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result23.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_16c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_16c0 = "";
    local_16d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_16d0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_57.m_end = pvVar8;
    msg_57.m_begin = pvVar7;
    file_57.m_end = (iterator)0x2ba;
    file_57.m_begin = (iterator)&local_16c8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_16d8,
               msg_57);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_16e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_16e0 = "";
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         SelectionResult::GetSelectedValue((SelectionResult *)&result21);
    pvVar7 = (iterator)0x2;
    poVar11 = &result23;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result22,&local_16e8,0x2ba,1,2,poVar11,"result21->GetSelectedValue()",&CENT,"CENT");
    local_16f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_16f0 = "";
    local_1708 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1700 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_58.m_end = (iterator)poVar11;
    msg_58.m_begin = pvVar7;
    file_58.m_end = (iterator)0x2bb;
    file_58.m_begin = (iterator)&local_16f8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_1708,
               msg_58);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1718 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1710 = "";
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result21);
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_1800._M_color = 2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result22,&local_1718,699,1,2,&result23,"result21->GetInputSet().size()",&local_1800,
               "2U");
    CoinsResult::Clear(&available_coins);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 50000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result22,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 1000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result22,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
    result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 100000000;
    pvVar7 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result22,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 0x5f60810;
    pFVar9 = &rand;
    KnapsackSolver(&result22,pvVar3,(CAmount *)&result23,1000000,pFVar9);
    local_1728 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1720 = "";
    local_1738 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1730 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61dd7e;
    msg_59.m_end = pvVar7;
    msg_59.m_begin = (iterator)pFVar9;
    file_59.m_end = (iterator)0x2c5;
    file_59.m_begin = (iterator)&local_1728;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,(size_t)&local_1738,
               msg_59);
    local_1800._M_color._0_1_ =
         result22.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    local_1800._M_parent = (_Base_ptr)0x0;
    local_1800._M_left = (_Base_ptr)0x0;
    local_17e0._0_8_ = "result22";
    local_17e0._8_8_ = (long)"result22" + 8;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_17e0;
    local_1748 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1740 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1800,(lazy_ostream *)&result23,1,0,WARN,_cVar17,
               (size_t)&local_1748,0x2c5);
    boost::detail::shared_count::~shared_count((shared_count *)&local_1800._M_left);
    local_1758 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1750 = "";
    local_1768 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1760 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_60.m_end = pvVar8;
    msg_60.m_begin = pvVar7;
    file_60.m_end = (iterator)0x2c6;
    file_60.m_begin = (iterator)&local_1758;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,(size_t)&local_1768,
               msg_60);
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1778 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1770 = "";
    local_1800._0_8_ = SelectionResult::GetSelectedValue((SelectionResult *)&result22);
    local_17e0._0_8_ = 0x605e690;
    pvVar7 = (iterator)0x2;
    pp_Var12 = (_Base_ptr *)&local_1800;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&result23,&local_1778,0x2c6,1,2,pp_Var12,"result22->GetSelectedValue()",local_17e0,
               "CENT * 10105 / 100");
    local_1788[0] =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1788[1] =
         (char *)((long)
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
                 + 0x72);
    local_1798[0] = &boost::unit_test::basic_cstring<char_const>::null;
    local_1798[1] = &boost::unit_test::basic_cstring<char_const>::null;
    msg_61.m_end = (iterator)pp_Var12;
    msg_61.m_begin = pvVar7;
    file_61.m_end = (iterator)0x2c7;
    file_61.m_begin = (iterator)local_1788;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)local_1798,
               msg_61);
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_17a8[0] =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_17a8[1] =
         (char *)((long)
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
                 + 0x72);
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result22);
    local_1800._0_8_ = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_17e0._0_4_ = 3;
    pp_Var12 = (_Base_ptr *)&local_1800;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&result23,local_17a8,0x2c7,1,2,pp_Var12,"result22->GetInputSet().size()",local_17e0,
               "3U");
    pvVar3 = KnapsackGroupOutputs
                       (&available_coins,
                        (CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                        (CoinEligibilityFilter *)filter_confirmed);
    local_1800._0_8_ = (_Base_ptr)0x5f45a60;
    pFVar9 = &rand;
    KnapsackSolver(&result23,pvVar3,(CAmount *)&local_1800,1000000,pFVar9);
    local_17b8[0] =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_17b8[1] =
         (char *)((long)
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
                 + 0x72);
    local_17c8[0] = &boost::unit_test::basic_cstring<char_const>::null;
    local_17c8[1] = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61e0d0;
    msg_62.m_end = (iterator)pp_Var12;
    msg_62.m_begin = (iterator)pFVar9;
    file_62.m_end = (iterator)0x2cb;
    file_62.m_begin = (iterator)local_17b8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,(size_t)local_17c8,
               msg_62);
    local_17e0[0] =
         result23.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    local_17e0._8_8_ = (element_type *)0x0;
    local_17e0._16_8_ = (_Base_ptr)0x0;
    local_1810._0_8_ = "result23";
    local_1810._8_8_ = "";
    local_1800._M_parent = (_Base_ptr)((ulong)local_1800._M_parent & 0xffffffffffffff00);
    local_1800._0_8_ = &PTR__lazy_ostream_0113a070;
    local_1800._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_1800._M_right = (_Base_ptr)local_1810;
    local_1820 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1818 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_17e0,(lazy_ostream *)&local_1800,1,0,WARN,_cVar17,
               (size_t)&local_1820,0x2cb);
    boost::detail::shared_count::~shared_count((shared_count *)(local_17e0 + 0x10));
    local_1830 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1828 = "";
    local_1840 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1838 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_63.m_end = pvVar8;
    msg_63.m_begin = pvVar7;
    file_63.m_end = (iterator)0x2cc;
    file_63.m_begin = (iterator)&local_1830;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_63,(size_t)&local_1840,
               msg_63);
    local_1800._M_parent = (_Base_ptr)((ulong)local_1800._M_parent & 0xffffffffffffff00);
    local_1800._0_8_ = &PTR__lazy_ostream_01139f30;
    local_1800._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_1800._M_right = (_Base_ptr)0xc694e1;
    local_1850 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1848 = "";
    local_17e0._0_8_ = SelectionResult::GetSelectedValue((SelectionResult *)&result23);
    local_1810._0_8_ = 101000000;
    pvVar8 = (iterator)0x2;
    pvVar7 = local_17e0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_1800,&local_1850,0x2cc,1,2,pvVar7,"result23->GetSelectedValue()",local_1810,
               "101 * CENT");
    local_1860 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1858 = "";
    local_1870 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1868 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_64.m_end = pvVar7;
    msg_64.m_begin = pvVar8;
    file_64.m_end = (iterator)0x2cd;
    file_64.m_begin = (iterator)&local_1860;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_64,(size_t)&local_1870,
               msg_64);
    local_1800._M_parent = (_Base_ptr)((ulong)local_1800._M_parent & 0xffffffffffffff00);
    local_1800._0_8_ = &PTR__lazy_ostream_01139f30;
    local_1800._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_1800._M_right = (_Base_ptr)0xc694e1;
    local_1880 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1878 = "";
    psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result23);
    local_17e0._0_8_ = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_1810._0_4_ = 2;
    in_R8 = (iterator)0x2;
    in_R9 = (optional<wallet::SelectionResult> *)local_17e0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&local_1800,&local_1880,0x2cd);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result23);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result22);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result21);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result20);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result19);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result18);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result17);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result16);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result15);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result14);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result13);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result12);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result11);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result10);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result9);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result8);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result7);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result6);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result5);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result4);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result3);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result2);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result1);
    iVar13 = in_stack_ffffffffffffe4d8 + 1;
  }
  for (result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
       super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 0x5dc;
      (long)result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
            super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
            super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ < 100000000;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ * 10) {
    CoinsResult::Clear(&available_coins);
    sVar6 = 0x2a4;
    while (bVar15 = sVar6 != 0, sVar6 = sVar6 + -1, bVar15) {
      in_R9 = (optional<wallet::SelectionResult> *)0x0;
      add_coin(&available_coins,
               (CWallet *)
               wallet._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result5,
               (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
    }
    iVar13 = 100;
    while (bVar15 = iVar13 != 0, iVar13 = iVar13 + -1, bVar15) {
      pvVar3 = KnapsackGroupOutputs
                         (&available_coins,
                          (CWallet *)
                          wallet._M_t.
                          super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                          .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                          (CoinEligibilityFilter *)filter_confirmed);
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 2000;
      pFVar9 = &rand;
      KnapsackSolver(&result1,pvVar3,(CAmount *)&result2,1000000,pFVar9);
      local_1890 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1888 = "";
      local_18a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1898 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar17 = 0x61e5ce;
      msg_65.m_end = (iterator)in_R9;
      msg_65.m_begin = (iterator)pFVar9;
      file_65.m_end = (iterator)0x2da;
      file_65.m_begin = (iterator)&local_1890;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_65,(size_t)&local_18a0,
                 msg_65);
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
           result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           anon_var_dwarf_16d1d8e;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result24" + 8;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           &PTR__lazy_ostream_0113a070;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result4;
      local_18b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_18a8 = "";
      pvVar7 = &DAT_00000001;
      pvVar8 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&result3,(lazy_ostream *)&result2,1,0,WARN,_cVar17,
                 (size_t)&local_18b0,0x2da);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&result3.super__Optional_base<wallet::SelectionResult,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                         super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                         m_selected_inputs + 0x10));
      uVar2 = result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
              super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
              super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_;
      if ((long)result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ < 0xf4a10) {
        dVar16 = ceil(1002000.0 /
                      (double)(long)result5.
                                    super__Optional_base<wallet::SelectionResult,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>
                                    .super__Optional_payload_base<wallet::SelectionResult>.
                                    _M_payload._0_8_);
        result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_2_ = (short)(int)dVar16;
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             (ulong)((int)dVar16 & 0xffff) * uVar2;
        local_18c0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
        ;
        local_18b8 = "";
        local_18d0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_18c8 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_66.m_end = pvVar8;
        msg_66.m_begin = pvVar7;
        file_66.m_end = (iterator)0x2e0;
        file_66.m_begin = (iterator)&local_18c0;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_66,
                   (size_t)&local_18d0,msg_66);
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_01139f30;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
        local_18e0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
        ;
        local_18d8 = "";
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             SelectionResult::GetSelectedValue((SelectionResult *)&result1);
        pvVar7 = (iterator)0x2;
        poVar11 = &result4;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                  ((lazy_ostream *)&result2,&local_18e0,0x2e0,1,2,poVar11,
                   "result24->GetSelectedValue()",&result3,"returnValue");
        local_18f0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
        ;
        local_18e8 = "";
        local_1900 = &boost::unit_test::basic_cstring<char_const>::null;
        local_18f8 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_67.m_end = (iterator)poVar11;
        msg_67.m_begin = pvVar7;
        file_67.m_end = (iterator)0x2e1;
        file_67.m_begin = (iterator)&local_18f0;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_67,
                   (size_t)&local_1900,msg_67);
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_01139f30;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
        local_1910 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
        ;
        local_1908 = "";
        psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result1);
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        in_R9 = &result4;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_short>
                  ((lazy_ostream *)&result2,&local_1910,0x2e1,1,2,in_R9,
                   "result24->GetInputSet().size()",&result6,"returnSize");
      }
      else {
        local_1920 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
        ;
        local_1918 = "";
        local_1930 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1928 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_68.m_end = pvVar8;
        msg_68.m_begin = pvVar7;
        file_68.m_end = (iterator)0x2e4;
        file_68.m_begin = (iterator)&local_1920;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_68,
                   (size_t)&local_1930,msg_68);
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_01139f30;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
        local_1940 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
        ;
        local_1938 = "";
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             SelectionResult::GetSelectedValue((SelectionResult *)&result1);
        pvVar7 = (iterator)0x2;
        poVar11 = &result3;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                  ((lazy_ostream *)&result2,&local_1940,0x2e4,1,2,poVar11,
                   "result24->GetSelectedValue()",&result5,"amt");
        local_1950 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
        ;
        local_1948 = "";
        local_1960 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1958 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_69.m_end = (iterator)poVar11;
        msg_69.m_begin = pvVar7;
        file_69.m_end = (iterator)0x2e5;
        file_69.m_begin = (iterator)&local_1950;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_69,
                   (size_t)&local_1960,msg_69);
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             &PTR__lazy_ostream_01139f30;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
        local_1970 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
        ;
        local_1968 = "";
        psVar4 = SelectionResult::GetInputSet((SelectionResult *)&result1);
        result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
             (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 1;
        in_R9 = &result3;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                  ((lazy_ostream *)&result2,&local_1970,0x2e5,1,2,in_R9,
                   "result24->GetInputSet().size()",&result4,"1U");
      }
      std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
                ((_Optional_payload_base<wallet::SelectionResult> *)&result1);
    }
  }
  CoinsResult::Clear(&available_coins);
  iVar13 = 100;
  while (bVar15 = iVar13 != 0, iVar13 = iVar13 + -1, bVar15) {
    in_R9 = (optional<wallet::SelectionResult> *)0x0;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,&COIN,(CFeeRate)0x0,0x90,
             false,0,false,in_stack_ffffffffffffe4d8);
  }
  iVar13 = 0;
  while( true ) {
    if (iVar13 == 100) break;
    CoinsResult::All((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result2,
                     &available_coins);
    pvVar3 = GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result2,false)
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 5000000000;
    pFVar9 = &rand;
    KnapsackSolver(&result1,pvVar3,(CAmount *)&result3,1000000,pFVar9);
    std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
              ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result2);
    local_1980 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1978 = "";
    local_1990 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1988 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61ebda;
    msg_70.m_end = (iterator)in_R9;
    msg_70.m_begin = (iterator)pFVar9;
    file_70.m_end = (iterator)0x2f5;
    file_70.m_begin = (iterator)&local_1980;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_70,(size_t)&local_1990,
               msg_70);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1ddc;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result25" + 8;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result4;
    local_19a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1998 = "";
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result3,(lazy_ostream *)&result2,1,0,WARN,_cVar17,
               (size_t)&local_19a0,0x2f5);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result3.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    CoinsResult::All((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result3,
                     &available_coins);
    pvVar3 = GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result3,false)
    ;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 5000000000;
    pFVar9 = &rand;
    KnapsackSolver(&result2,pvVar3,(CAmount *)&result4,1000000,pFVar9);
    std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
              ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result3);
    local_19b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_19a8 = "";
    local_19c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_19b8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar17 = 0x61ed38;
    msg_71.m_end = pvVar7;
    msg_71.m_begin = (iterator)pFVar9;
    file_71.m_end = (iterator)0x2f7;
    file_71.m_begin = (iterator)&local_19b0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_71,(size_t)&local_19c0,
               msg_71);
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
         result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1de9;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result26" + 8;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result5;
    local_19d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_19c8 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result4,(lazy_ostream *)&result3,1,0,WARN,_cVar17,
               (size_t)&local_19d0,0x2f7);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result4.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    local_19e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_19d8 = "";
    local_19f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_19e8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_72.m_end = pvVar8;
    msg_72.m_begin = pvVar7;
    file_72.m_end = (iterator)0x2f8;
    file_72.m_begin = (iterator)&local_19e0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_72,(size_t)&local_19f0,
               msg_72);
    _cVar17 = 0x61ee52;
    bVar15 = EqualResult((SelectionResult *)&result1,(SelectionResult *)&result2);
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ = !bVar15;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = anon_var_dwarf_16d1df6;
    result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         (long)"!EqualResult(*result25, *result26)" + 0x22;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_0113a070;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result5;
    local_1a00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_19f8 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result4,(lazy_ostream *)&result3,1,0,WARN,_cVar17,
               (size_t)&local_1a00,0x2f8);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&result4.super__Optional_base<wallet::SelectionResult,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                       super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                       m_selected_inputs + 0x10));
    result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ & 0xffffffff00000000
    ;
    in_stack_ffffffffffffe4d8 = 5;
    while( true ) {
      bVar15 = in_stack_ffffffffffffe4d8 == 0;
      in_stack_ffffffffffffe4d8 = in_stack_ffffffffffffe4d8 + -1;
      if (bVar15) break;
      CoinsResult::All((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result4,
                       &available_coins);
      pvVar3 = GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result4,
                          false);
      pFVar9 = &rand;
      KnapsackSolver(&result3,pvVar3,&COIN,1000000,pFVar9);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result4);
      local_1a10 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1a08 = "";
      local_1a20 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1a18 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar17 = 0x61efd4;
      msg_73.m_end = pvVar8;
      msg_73.m_begin = (iterator)pFVar9;
      file_73.m_end = (iterator)0x302;
      file_73.m_begin = (iterator)&local_1a10;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_73,(size_t)&local_1a20,
                 msg_73);
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
           result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           anon_var_dwarf_16d1e11;
      result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result27" + 8;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
           result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ &
           0xffffffffffffff00;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           &PTR__lazy_ostream_0113a070;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result6;
      local_1a30 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1a28 = "";
      pvVar7 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&result5,(lazy_ostream *)&result4,1,0,WARN,_cVar17,
                 (size_t)&local_1a30,0x302);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&result5.super__Optional_base<wallet::SelectionResult,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                         super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                         m_selected_inputs + 0x10));
      CoinsResult::All((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result5,
                       &available_coins);
      pvVar3 = GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result5,
                          false);
      pFVar9 = &rand;
      KnapsackSolver(&result4,pvVar3,&COIN,1000000,pFVar9);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result5);
      local_1a40 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1a38 = "";
      local_1a50 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1a48 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar17 = 0x61f12f;
      msg_74.m_end = pvVar7;
      msg_74.m_begin = (iterator)pFVar9;
      file_74.m_end = (iterator)0x304;
      file_74.m_begin = (iterator)&local_1a40;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_74,(size_t)&local_1a50,
                 msg_74);
      result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
           result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
      result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
      result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           anon_var_dwarf_16d1e1e;
      result7.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result28" + 8;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
           result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ &
           0xffffffffffffff00;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           &PTR__lazy_ostream_0113a070;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result7;
      local_1a60 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1a58 = "";
      pvVar7 = &DAT_00000001;
      pvVar8 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&result6,(lazy_ostream *)&result5,1,0,WARN,_cVar17,
                 (size_t)&local_1a60,0x304);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&result6.super__Optional_base<wallet::SelectionResult,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                         super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                         m_selected_inputs + 0x10));
      bVar15 = EqualResult((SelectionResult *)&result3,(SelectionResult *)&result4);
      if (bVar15) {
        result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ =
             result8.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ + 1;
      }
      std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
                ((_Optional_payload_base<wallet::SelectionResult> *)&result4);
      std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
                ((_Optional_payload_base<wallet::SelectionResult> *)&result3);
    }
    local_1a70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1a68 = "";
    local_1a80 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a78 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_75.m_end = pvVar8;
    msg_75.m_begin = pvVar7;
    file_75.m_end = (iterator)0x308;
    file_75.m_begin = (iterator)&local_1a70;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_75,(size_t)&local_1a80,
               msg_75);
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
         result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ & 0xffffffffffffff00
    ;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1a90 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1a88 = "";
    result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 5;
    in_R9 = &result8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,int,int>
              (&result3,&local_1a90,0x308,1,3,in_R9,"fails",&result4,"5");
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result2);
    std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
              ((_Optional_payload_base<wallet::SelectionResult> *)&result1);
    iVar13 = iVar13 + 1;
  }
  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 5000000;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result1,
           (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 10000000;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result1,
           (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
       (long)"NSt8__detail11_AnyMatcherINSt7__cxx1112regex_traitsIcEELb0ELb1ELb0EEE" + 0x41;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result1,
           (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 20000000;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result1,
           (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
  result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 25000000;
  pvVar7 = (iterator)0x90;
  poVar11 = (optional<wallet::SelectionResult> *)0x0;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result1,
           (CFeeRate)0x0,0x90,false,0,false,in_stack_ffffffffffffe4d8);
  for (iVar13 = 0; iVar13 != 100; iVar13 = iVar13 + 1) {
    result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
         super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ & 0xffffffff00000000
    ;
    iVar14 = 5;
    while( true ) {
      bVar15 = iVar14 == 0;
      iVar14 = iVar14 + -1;
      if (bVar15) break;
      CoinsResult::All((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result2,
                       &available_coins);
      pvVar3 = GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result2,
                          false);
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 90000000;
      pFVar9 = &rand;
      KnapsackSolver(&result1,pvVar3,(CAmount *)&result3,1000000,pFVar9);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result2);
      local_1aa0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1a98 = "";
      local_1ab0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1aa8 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar17 = 0x61f551;
      msg_76.m_end = (iterator)poVar11;
      msg_76.m_begin = (iterator)pFVar9;
      file_76.m_end = (iterator)0x319;
      file_76.m_begin = (iterator)&local_1aa0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_76,(size_t)&local_1ab0,
                 msg_76);
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
           result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           anon_var_dwarf_16d1e53;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result29" + 8;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           &PTR__lazy_ostream_0113a070;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result4;
      local_1ac0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1ab8 = "";
      pvVar7 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&result3,(lazy_ostream *)&result2,1,0,WARN,_cVar17,
                 (size_t)&local_1ac0,0x319);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&result3.super__Optional_base<wallet::SelectionResult,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                         super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                         m_selected_inputs + 0x10));
      CoinsResult::All((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result3,
                       &available_coins);
      pvVar3 = GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result3,
                          false);
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 90000000;
      pFVar9 = &rand;
      KnapsackSolver(&result2,pvVar3,(CAmount *)&result4,1000000,pFVar9);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&result3);
      local_1ad0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1ac8 = "";
      local_1ae0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1ad8 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar17 = 0x61f69c;
      msg_77.m_end = pvVar7;
      msg_77.m_begin = (iterator)pFVar9;
      file_77.m_end = (iterator)0x31b;
      file_77.m_begin = (iterator)&local_1ad0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_77,(size_t)&local_1ae0,
                 msg_77);
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_1_ =
           result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = 0;
      result4.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           anon_var_dwarf_16d1e60;
      result5.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ = (long)"result30" + 8;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ =
           result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
           super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
           super__Optional_payload_base<wallet::SelectionResult>._M_payload._8_8_ &
           0xffffffffffffff00;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
           &PTR__lazy_ostream_0113a070;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      result3.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result5;
      local_1af0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1ae8 = "";
      poVar11 = (optional<wallet::SelectionResult> *)0x0;
      pvVar7 = &DAT_00000001;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&result4,(lazy_ostream *)&result3,1,0,WARN,_cVar17,
                 (size_t)&local_1af0,0x31b);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&result4.super__Optional_base<wallet::SelectionResult,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                         super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.
                         m_selected_inputs + 0x10));
      bVar15 = EqualResult((SelectionResult *)&result1,(SelectionResult *)&result2);
      if (bVar15) {
        result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
        super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
        super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ =
             result6.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
             super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
             super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ + 1;
      }
      std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
                ((_Optional_payload_base<wallet::SelectionResult> *)&result2);
      std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
                ((_Optional_payload_base<wallet::SelectionResult> *)&result1);
    }
    local_1b00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1af8 = "";
    local_1b10 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1b08 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_78.m_end = (iterator)poVar11;
    msg_78.m_begin = pvVar7;
    file_78.m_end = (iterator)0x31f;
    file_78.m_begin = (iterator)&local_1b00;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_78,(size_t)&local_1b10,
               msg_78);
    result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 0;
    result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ =
         &PTR__lazy_ostream_01139f30;
    result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    result1.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._M_value.m_selected_inputs._M_t
    ._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xc694e1;
    local_1b20 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_1b18 = "";
    result2.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_4_ = 5;
    pvVar7 = (iterator)0x3;
    poVar11 = &result6;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,int,int>
              ((_Optional_payload_base<wallet::SelectionResult> *)&result1,&local_1b20,799,1,3,
               poVar11,"fails",(_Optional_payload_base<wallet::SelectionResult> *)&result2,"5");
  }
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&available_coins);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&wallet);
  ChaCha20::~ChaCha20(&rand.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(knapsack_solver_test)
{
    FastRandomContext rand{};
    const auto temp1{[&rand](std::vector<OutputGroup>& g, const CAmount& v, CAmount c) { return KnapsackSolver(g, v, c, rand); }};
    const auto KnapsackSolver{temp1};
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);

    CoinsResult available_coins;

    // test multiple times to allow for differences in the shuffle order
    for (int i = 0; i < RUN_TESTS; i++)
    {
        available_coins.Clear();

        // with an empty wallet we can't even pay one cent
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 1 * CENT, CENT));

        add_coin(available_coins, *wallet, 1*CENT, CFeeRate(0), 4);        // add a new 1 cent coin

        // with a new 1 cent coin, we still can't find a mature 1 cent
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 1 * CENT, CENT));

        // but we can find a new 1 cent
        const auto result1 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 1 * CENT, CENT);
        BOOST_CHECK(result1);
        BOOST_CHECK_EQUAL(result1->GetSelectedValue(), 1 * CENT);

        add_coin(available_coins, *wallet, 2*CENT);           // add a mature 2 cent coin

        // we can't make 3 cents of mature coins
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 3 * CENT, CENT));

        // we can make 3 cents of new coins
        const auto result2 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 3 * CENT, CENT);
        BOOST_CHECK(result2);
        BOOST_CHECK_EQUAL(result2->GetSelectedValue(), 3 * CENT);

        add_coin(available_coins, *wallet, 5*CENT);           // add a mature 5 cent coin,
        add_coin(available_coins, *wallet, 10*CENT, CFeeRate(0), 3, true); // a new 10 cent coin sent from one of our own addresses
        add_coin(available_coins, *wallet, 20*CENT);          // and a mature 20 cent coin

        // now we have new: 1+10=11 (of which 10 was self-sent), and mature: 2+5+20=27.  total = 38

        // we can't make 38 cents only if we disallow new coins:
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 38 * CENT, CENT));
        // we can't even make 37 cents if we don't allow new coins even if they're from us
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard_extra), 38 * CENT, CENT));
        // but we can make 37 cents if we accept new coins from ourself
        const auto result3 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 37 * CENT, CENT);
        BOOST_CHECK(result3);
        BOOST_CHECK_EQUAL(result3->GetSelectedValue(), 37 * CENT);
        // and we can make 38 cents if we accept all new coins
        const auto result4 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 38 * CENT, CENT);
        BOOST_CHECK(result4);
        BOOST_CHECK_EQUAL(result4->GetSelectedValue(), 38 * CENT);

        // try making 34 cents from 1,2,5,10,20 - we can't do it exactly
        const auto result5 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 34 * CENT, CENT);
        BOOST_CHECK(result5);
        BOOST_CHECK_EQUAL(result5->GetSelectedValue(), 35 * CENT);       // but 35 cents is closest
        BOOST_CHECK_EQUAL(result5->GetInputSet().size(), 3U);     // the best should be 20+10+5.  it's incredibly unlikely the 1 or 2 got included (but possible)

        // when we try making 7 cents, the smaller coins (1,2,5) are enough.  We should see just 2+5
        const auto result6 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 7 * CENT, CENT);
        BOOST_CHECK(result6);
        BOOST_CHECK_EQUAL(result6->GetSelectedValue(), 7 * CENT);
        BOOST_CHECK_EQUAL(result6->GetInputSet().size(), 2U);

        // when we try making 8 cents, the smaller coins (1,2,5) are exactly enough.
        const auto result7 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 8 * CENT, CENT);
        BOOST_CHECK(result7);
        BOOST_CHECK(result7->GetSelectedValue() == 8 * CENT);
        BOOST_CHECK_EQUAL(result7->GetInputSet().size(), 3U);

        // when we try making 9 cents, no subset of smaller coins is enough, and we get the next bigger coin (10)
        const auto result8 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 9 * CENT, CENT);
        BOOST_CHECK(result8);
        BOOST_CHECK_EQUAL(result8->GetSelectedValue(), 10 * CENT);
        BOOST_CHECK_EQUAL(result8->GetInputSet().size(), 1U);

        // now clear out the wallet and start again to test choosing between subsets of smaller coins and the next biggest coin
        available_coins.Clear();

        add_coin(available_coins, *wallet,  6*CENT);
        add_coin(available_coins, *wallet,  7*CENT);
        add_coin(available_coins, *wallet,  8*CENT);
        add_coin(available_coins, *wallet, 20*CENT);
        add_coin(available_coins, *wallet, 30*CENT); // now we have 6+7+8+20+30 = 71 cents total

        // check that we have 71 and not 72
        const auto result9 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 71 * CENT, CENT);
        BOOST_CHECK(result9);
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 72 * CENT, CENT));

        // now try making 16 cents.  the best smaller coins can do is 6+7+8 = 21; not as good at the next biggest coin, 20
        const auto result10 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 16 * CENT, CENT);
        BOOST_CHECK(result10);
        BOOST_CHECK_EQUAL(result10->GetSelectedValue(), 20 * CENT); // we should get 20 in one coin
        BOOST_CHECK_EQUAL(result10->GetInputSet().size(), 1U);

        add_coin(available_coins, *wallet,  5*CENT); // now we have 5+6+7+8+20+30 = 75 cents total

        // now if we try making 16 cents again, the smaller coins can make 5+6+7 = 18 cents, better than the next biggest coin, 20
        const auto result11 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 16 * CENT, CENT);
        BOOST_CHECK(result11);
        BOOST_CHECK_EQUAL(result11->GetSelectedValue(), 18 * CENT); // we should get 18 in 3 coins
        BOOST_CHECK_EQUAL(result11->GetInputSet().size(), 3U);

        add_coin(available_coins, *wallet,  18*CENT); // now we have 5+6+7+8+18+20+30

        // and now if we try making 16 cents again, the smaller coins can make 5+6+7 = 18 cents, the same as the next biggest coin, 18
        const auto result12 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 16 * CENT, CENT);
        BOOST_CHECK(result12);
        BOOST_CHECK_EQUAL(result12->GetSelectedValue(), 18 * CENT);  // we should get 18 in 1 coin
        BOOST_CHECK_EQUAL(result12->GetInputSet().size(), 1U); // because in the event of a tie, the biggest coin wins

        // now try making 11 cents.  we should get 5+6
        const auto result13 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 11 * CENT, CENT);
        BOOST_CHECK(result13);
        BOOST_CHECK_EQUAL(result13->GetSelectedValue(), 11 * CENT);
        BOOST_CHECK_EQUAL(result13->GetInputSet().size(), 2U);

        // check that the smallest bigger coin is used
        add_coin(available_coins, *wallet,  1*COIN);
        add_coin(available_coins, *wallet,  2*COIN);
        add_coin(available_coins, *wallet,  3*COIN);
        add_coin(available_coins, *wallet,  4*COIN); // now we have 5+6+7+8+18+20+30+100+200+300+400 = 1094 cents
        const auto result14 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 95 * CENT, CENT);
        BOOST_CHECK(result14);
        BOOST_CHECK_EQUAL(result14->GetSelectedValue(), 1 * COIN);  // we should get 1 BTC in 1 coin
        BOOST_CHECK_EQUAL(result14->GetInputSet().size(), 1U);

        const auto result15 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 195 * CENT, CENT);
        BOOST_CHECK(result15);
        BOOST_CHECK_EQUAL(result15->GetSelectedValue(), 2 * COIN);  // we should get 2 BTC in 1 coin
        BOOST_CHECK_EQUAL(result15->GetInputSet().size(), 1U);

        // empty the wallet and start again, now with fractions of a cent, to test small change avoidance

        available_coins.Clear();
        add_coin(available_coins, *wallet, CENT * 1 / 10);
        add_coin(available_coins, *wallet, CENT * 2 / 10);
        add_coin(available_coins, *wallet, CENT * 3 / 10);
        add_coin(available_coins, *wallet, CENT * 4 / 10);
        add_coin(available_coins, *wallet, CENT * 5 / 10);

        // try making 1 * CENT from the 1.5 * CENT
        // we'll get change smaller than CENT whatever happens, so can expect CENT exactly
        const auto result16 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), CENT, CENT);
        BOOST_CHECK(result16);
        BOOST_CHECK_EQUAL(result16->GetSelectedValue(), CENT);

        // but if we add a bigger coin, small change is avoided
        add_coin(available_coins, *wallet, 1111*CENT);

        // try making 1 from 0.1 + 0.2 + 0.3 + 0.4 + 0.5 + 1111 = 1112.5
        const auto result17 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 1 * CENT, CENT);
        BOOST_CHECK(result17);
        BOOST_CHECK_EQUAL(result17->GetSelectedValue(), 1 * CENT); // we should get the exact amount

        // if we add more small coins:
        add_coin(available_coins, *wallet, CENT * 6 / 10);
        add_coin(available_coins, *wallet, CENT * 7 / 10);

        // and try again to make 1.0 * CENT
        const auto result18 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 1 * CENT, CENT);
        BOOST_CHECK(result18);
        BOOST_CHECK_EQUAL(result18->GetSelectedValue(), 1 * CENT); // we should get the exact amount

        // run the 'mtgox' test (see https://blockexplorer.com/tx/29a3efd3ef04f9153d47a990bd7b048a4b2d213daaa5fb8ed670fb85f13bdbcf)
        // they tried to consolidate 10 50k coins into one 500k coin, and ended up with 50k in change
        available_coins.Clear();
        for (int j = 0; j < 20; j++)
            add_coin(available_coins, *wallet, 50000 * COIN);

        const auto result19 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 500000 * COIN, CENT);
        BOOST_CHECK(result19);
        BOOST_CHECK_EQUAL(result19->GetSelectedValue(), 500000 * COIN); // we should get the exact amount
        BOOST_CHECK_EQUAL(result19->GetInputSet().size(), 10U); // in ten coins

        // if there's not enough in the smaller coins to make at least 1 * CENT change (0.5+0.6+0.7 < 1.0+1.0),
        // we need to try finding an exact subset anyway

        // sometimes it will fail, and so we use the next biggest coin:
        available_coins.Clear();
        add_coin(available_coins, *wallet, CENT * 5 / 10);
        add_coin(available_coins, *wallet, CENT * 6 / 10);
        add_coin(available_coins, *wallet, CENT * 7 / 10);
        add_coin(available_coins, *wallet, 1111 * CENT);
        const auto result20 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 1 * CENT, CENT);
        BOOST_CHECK(result20);
        BOOST_CHECK_EQUAL(result20->GetSelectedValue(), 1111 * CENT); // we get the bigger coin
        BOOST_CHECK_EQUAL(result20->GetInputSet().size(), 1U);

        // but sometimes it's possible, and we use an exact subset (0.4 + 0.6 = 1.0)
        available_coins.Clear();
        add_coin(available_coins, *wallet, CENT * 4 / 10);
        add_coin(available_coins, *wallet, CENT * 6 / 10);
        add_coin(available_coins, *wallet, CENT * 8 / 10);
        add_coin(available_coins, *wallet, 1111 * CENT);
        const auto result21 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), CENT, CENT);
        BOOST_CHECK(result21);
        BOOST_CHECK_EQUAL(result21->GetSelectedValue(), CENT);   // we should get the exact amount
        BOOST_CHECK_EQUAL(result21->GetInputSet().size(), 2U); // in two coins 0.4+0.6

        // test avoiding small change
        available_coins.Clear();
        add_coin(available_coins, *wallet, CENT * 5 / 100);
        add_coin(available_coins, *wallet, CENT * 1);
        add_coin(available_coins, *wallet, CENT * 100);

        // trying to make 100.01 from these three coins
        const auto result22 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), CENT * 10001 / 100, CENT);
        BOOST_CHECK(result22);
        BOOST_CHECK_EQUAL(result22->GetSelectedValue(), CENT * 10105 / 100); // we should get all coins
        BOOST_CHECK_EQUAL(result22->GetInputSet().size(), 3U);

        // but if we try to make 99.9, we should take the bigger of the two small coins to avoid small change
        const auto result23 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), CENT * 9990 / 100, CENT);
        BOOST_CHECK(result23);
        BOOST_CHECK_EQUAL(result23->GetSelectedValue(), 101 * CENT);
        BOOST_CHECK_EQUAL(result23->GetInputSet().size(), 2U);
    }

    // test with many inputs
    for (CAmount amt=1500; amt < COIN; amt*=10) {
        available_coins.Clear();
        // Create 676 inputs (=  (old MAX_STANDARD_TX_SIZE == 100000)  / 148 bytes per input)
        for (uint16_t j = 0; j < 676; j++)
            add_coin(available_coins, *wallet, amt);

        // We only create the wallet once to save time, but we still run the coin selection RUN_TESTS times.
        for (int i = 0; i < RUN_TESTS; i++) {
            const auto result24 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 2000, CENT);
            BOOST_CHECK(result24);

            if (amt - 2000 < CENT) {
                // needs more than one input:
                uint16_t returnSize = std::ceil((2000.0 + CENT)/amt);
                CAmount returnValue = amt * returnSize;
                BOOST_CHECK_EQUAL(result24->GetSelectedValue(), returnValue);
                BOOST_CHECK_EQUAL(result24->GetInputSet().size(), returnSize);
            } else {
                // one input is sufficient:
                BOOST_CHECK_EQUAL(result24->GetSelectedValue(), amt);
                BOOST_CHECK_EQUAL(result24->GetInputSet().size(), 1U);
            }
        }
    }

    // test randomness
    {
        available_coins.Clear();
        for (int i2 = 0; i2 < 100; i2++)
            add_coin(available_coins, *wallet, COIN);

        // Again, we only create the wallet once to save time, but we still run the coin selection RUN_TESTS times.
        for (int i = 0; i < RUN_TESTS; i++) {
            // picking 50 from 100 coins doesn't depend on the shuffle,
            // but does depend on randomness in the stochastic approximation code
            const auto result25 = KnapsackSolver(GroupCoins(available_coins.All()), 50 * COIN, CENT);
            BOOST_CHECK(result25);
            const auto result26 = KnapsackSolver(GroupCoins(available_coins.All()), 50 * COIN, CENT);
            BOOST_CHECK(result26);
            BOOST_CHECK(!EqualResult(*result25, *result26));

            int fails = 0;
            for (int j = 0; j < RANDOM_REPEATS; j++)
            {
                // Test that the KnapsackSolver selects randomly from equivalent coins (same value and same input size).
                // When choosing 1 from 100 identical coins, 1% of the time, this test will choose the same coin twice
                // which will cause it to fail.
                // To avoid that issue, run the test RANDOM_REPEATS times and only complain if all of them fail
                const auto result27 = KnapsackSolver(GroupCoins(available_coins.All()), COIN, CENT);
                BOOST_CHECK(result27);
                const auto result28 = KnapsackSolver(GroupCoins(available_coins.All()), COIN, CENT);
                BOOST_CHECK(result28);
                if (EqualResult(*result27, *result28))
                    fails++;
            }
            BOOST_CHECK_NE(fails, RANDOM_REPEATS);
        }

        // add 75 cents in small change.  not enough to make 90 cents,
        // then try making 90 cents.  there are multiple competing "smallest bigger" coins,
        // one of which should be picked at random
        add_coin(available_coins, *wallet, 5 * CENT);
        add_coin(available_coins, *wallet, 10 * CENT);
        add_coin(available_coins, *wallet, 15 * CENT);
        add_coin(available_coins, *wallet, 20 * CENT);
        add_coin(available_coins, *wallet, 25 * CENT);

        for (int i = 0; i < RUN_TESTS; i++) {
            int fails = 0;
            for (int j = 0; j < RANDOM_REPEATS; j++)
            {
                const auto result29 = KnapsackSolver(GroupCoins(available_coins.All()), 90 * CENT, CENT);
                BOOST_CHECK(result29);
                const auto result30 = KnapsackSolver(GroupCoins(available_coins.All()), 90 * CENT, CENT);
                BOOST_CHECK(result30);
                if (EqualResult(*result29, *result30))
                    fails++;
            }
            BOOST_CHECK_NE(fails, RANDOM_REPEATS);
        }
    }
}